

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

CMbuffer cm_buffer_dump_list(CManager_conflict cm)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CMbuffer p_Var3;
  CMbuffer p_Var2;
  
  p_Var3 = cm->cm_buffer_list;
  iVar1 = puts("Known CM buffers are:");
  p_Var2 = (CMbuffer)CONCAT44(extraout_var,iVar1);
  for (; p_Var3 != (CMbuffer)0x0; p_Var3 = p_Var3->next) {
    iVar1 = printf("Buffer begin %p, size %zd, end %p\n",p_Var3->buffer,p_Var3->size,
                   (long)p_Var3->buffer + p_Var3->size);
    p_Var2 = (CMbuffer)CONCAT44(extraout_var_00,iVar1);
  }
  return p_Var2;
}

Assistant:

static CMbuffer
 cm_buffer_dump_list(CManager cm)
 {
     CMbuffer tmp = cm->cm_buffer_list;
     printf("Known CM buffers are:\n");
     while (tmp != NULL) {
	 printf("Buffer begin %p, size %zd, end %p\n",
		tmp->buffer, tmp->size, (char*)tmp->buffer + tmp->size);
	 tmp = tmp->next;
     }
     return NULL;
 }